

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1d_cbs.c
# Opt level: O0

RK_S32 mpp_av1_film_grain_params
                 (AV1Context *ctx,BitReadCtx_t *gb,AV1RawFilmGrainParams *current,
                 AV1RawFrameHeader *frame_header)

{
  RK_U32 local_ec;
  RK_U32 local_dc;
  RK_U32 local_cc;
  undefined1 local_bc [4];
  RK_U8 local_b8 [4];
  RK_U32 value_28;
  RK_U32 value_27;
  RK_U32 value_26;
  RK_U32 value_25;
  RK_U32 value_24;
  RK_U32 value_23;
  RK_U32 value_22;
  RK_U32 value_21;
  RK_U32 value_20;
  RK_U32 value_19;
  RK_U32 value_18;
  RK_U32 value_17;
  RK_U32 value_16;
  RK_U32 value_15;
  RK_U32 value_14;
  RK_U32 value_13;
  RK_U32 value_12;
  RK_U32 value_11;
  RK_U32 value_10;
  RK_U32 value_9;
  RK_U32 value_8;
  RK_U32 value_7;
  RK_U32 value_6;
  RK_U32 value_5;
  RK_U32 value_4;
  RK_U32 value_3;
  RK_U32 value_2;
  RK_U32 value_1;
  RK_U32 value;
  RK_S32 err;
  RK_S32 i;
  RK_S32 num_pos_chroma;
  RK_S32 num_pos_luma;
  AV1RawSequenceHeader *seq;
  AV1RawFrameHeader *frame_header_local;
  AV1RawFilmGrainParams *current_local;
  BitReadCtx_t *gb_local;
  AV1Context *ctx_local;
  
  _num_pos_chroma = ctx->sequence_header;
  if ((_num_pos_chroma->film_grain_params_present == '\0') ||
     ((frame_header->show_frame == '\0' && (frame_header->showable_frame == '\0')))) {
    ctx_local._4_4_ = 0;
  }
  else {
    seq = (AV1RawSequenceHeader *)frame_header;
    frame_header_local = (AV1RawFrameHeader *)current;
    current_local = (AV1RawFilmGrainParams *)gb;
    gb_local = &ctx->gb;
    value_1 = mpp_av1_read_unsigned(gb,1,"apply_grain",&value_2,0,1);
    ctx_local._4_4_ = value_1;
    if (-1 < (int)value_1) {
      frame_header_local->show_existing_frame = (RK_U8)value_2;
      if (frame_header_local->show_existing_frame == '\0') {
        ctx_local._4_4_ = 0;
      }
      else {
        value_1 = mpp_av1_read_unsigned
                            ((BitReadCtx_t *)current_local,0x10,"grain_seed",&value_3,0,0xffff);
        ctx_local._4_4_ = value_1;
        if (-1 < (int)value_1) {
          *(undefined2 *)&frame_header_local->field_0x2 = (undefined2)value_3;
          if ((char)(seq->timing_info).time_scale == '\x01') {
            value_1 = mpp_av1_read_unsigned
                                ((BitReadCtx_t *)current_local,1,"update_grain",&value_4,0,1);
            if ((int)value_1 < 0) {
              return value_1;
            }
            *(undefined1 *)&frame_header_local->frame_presentation_time = (undefined1)value_4;
          }
          else {
            *(undefined1 *)&frame_header_local->frame_presentation_time = 1;
          }
          if ((char)frame_header_local->frame_presentation_time == '\0') {
            ctx_local._4_4_ =
                 mpp_av1_read_unsigned
                           ((BitReadCtx_t *)current_local,3,"film_grain_params_ref_idx",&value_5,0,7
                           );
            if (-1 < (int)ctx_local._4_4_) {
              *(undefined1 *)((long)&frame_header_local->frame_presentation_time + 1) =
                   (undefined1)value_5;
              ctx_local._4_4_ = 0;
            }
          }
          else {
            value_1 = mpp_av1_read_unsigned
                                ((BitReadCtx_t *)current_local,4,"num_y_points",&value_6,0,0xe);
            ctx_local._4_4_ = value_1;
            if (-1 < (int)value_1) {
              *(undefined1 *)((long)&frame_header_local->frame_presentation_time + 2) =
                   (undefined1)value_6;
              value = 0;
              while( true ) {
                if ((int)(uint)*(byte *)((long)&frame_header_local->frame_presentation_time + 2) <=
                    (int)value) break;
                if (value == 0) {
                  local_cc = 0;
                }
                else {
                  local_cc = *(byte *)((long)frame_header_local->buffer_removal_time +
                                      (long)(int)(value - 1) + -0x15) + 1;
                }
                value_1 = mpp_av1_read_unsigned
                                    ((BitReadCtx_t *)current_local,8,"point_y_value[i]",&value_7,
                                     local_cc,0xff - ((*(byte *)((long)&frame_header_local->
                                                                        frame_presentation_time + 2)
                                                      - value) + -1));
                if ((int)value_1 < 0) {
                  return value_1;
                }
                *(char *)((long)frame_header_local->buffer_removal_time + (long)(int)value + -0x15)
                     = (char)value_7;
                value_1 = mpp_av1_read_unsigned
                                    ((BitReadCtx_t *)current_local,8,"point_y_scaling[i]",&value_8,0
                                     ,0xff);
                if ((int)value_1 < 0) {
                  return value_1;
                }
                *(char *)((long)frame_header_local->buffer_removal_time + (long)(int)value + -7) =
                     (char)value_8;
                value = value + 1;
              }
              if ((_num_pos_chroma->color_config).mono_chrome == '\0') {
                value_1 = mpp_av1_read_unsigned
                                    ((BitReadCtx_t *)current_local,1,"chroma_scaling_from_luma",
                                     &value_9,0,1);
                if ((int)value_1 < 0) {
                  return value_1;
                }
                *(undefined1 *)((long)frame_header_local->buffer_removal_time + 7) =
                     (undefined1)value_9;
              }
              else {
                *(undefined1 *)((long)frame_header_local->buffer_removal_time + 7) = 0;
              }
              if ((((_num_pos_chroma->color_config).mono_chrome == '\0') &&
                  (*(char *)((long)frame_header_local->buffer_removal_time + 7) == '\0')) &&
                 (((_num_pos_chroma->color_config).subsampling_x != '\x01' ||
                  (((_num_pos_chroma->color_config).subsampling_y != '\x01' ||
                   (*(char *)((long)&frame_header_local->frame_presentation_time + 2) != '\0'))))))
              {
                value_1 = mpp_av1_read_unsigned
                                    ((BitReadCtx_t *)current_local,4,"num_cb_points",&value_10,0,10)
                ;
                if ((int)value_1 < 0) {
                  return value_1;
                }
                *(undefined1 *)(frame_header_local->buffer_removal_time + 2) = (undefined1)value_10;
                for (value = 0;
                    (int)value < (int)(uint)(byte)frame_header_local->buffer_removal_time[2];
                    value = value + 1) {
                  if (value == 0) {
                    local_dc = 0;
                  }
                  else {
                    local_dc = *(byte *)((long)frame_header_local->buffer_removal_time +
                                        (long)(int)(value - 1) + 9) + 1;
                  }
                  value_1 = mpp_av1_read_unsigned
                                      ((BitReadCtx_t *)current_local,8,"point_cb_value[i]",&value_11
                                       ,local_dc,
                                       0xff - (((byte)frame_header_local->buffer_removal_time[2] -
                                               value) + -1));
                  if ((int)value_1 < 0) {
                    return value_1;
                  }
                  *(char *)((long)frame_header_local->buffer_removal_time + (long)(int)value + 9) =
                       (char)value_11;
                  value_1 = mpp_av1_read_unsigned
                                      ((BitReadCtx_t *)current_local,8,"point_cb_scaling[i]",
                                       &value_12,0,0xff);
                  if ((int)value_1 < 0) {
                    return value_1;
                  }
                  *(char *)((long)frame_header_local->buffer_removal_time + (long)(int)value + 0x13)
                       = (char)value_12;
                }
                value_1 = mpp_av1_read_unsigned
                                    ((BitReadCtx_t *)current_local,4,"num_cr_points",&value_13,0,10)
                ;
                if ((int)value_1 < 0) {
                  return value_1;
                }
                *(undefined1 *)((long)frame_header_local->buffer_removal_time + 0x1d) =
                     (undefined1)value_13;
                value = 0;
                while( true ) {
                  if ((int)(uint)*(byte *)((long)frame_header_local->buffer_removal_time + 0x1d) <=
                      (int)value) break;
                  if (value == 0) {
                    local_ec = 0;
                  }
                  else {
                    local_ec = *(byte *)((long)frame_header_local->buffer_removal_time +
                                        (long)(int)(value - 1) + 0x1e) + 1;
                  }
                  value_1 = mpp_av1_read_unsigned
                                      ((BitReadCtx_t *)current_local,8,"point_cr_value[i]",&value_14
                                       ,local_ec,
                                       0xff - ((*(byte *)((long)frame_header_local->
                                                                buffer_removal_time + 0x1d) - value)
                                              + -1));
                  if ((int)value_1 < 0) {
                    return value_1;
                  }
                  *(char *)((long)frame_header_local->buffer_removal_time + (long)(int)value + 0x1e)
                       = (char)value_14;
                  value_1 = mpp_av1_read_unsigned
                                      ((BitReadCtx_t *)current_local,8,"point_cr_scaling[i]",
                                       &value_15,0,0xff);
                  if ((int)value_1 < 0) {
                    return value_1;
                  }
                  *(char *)((long)frame_header_local->buffer_removal_time + (long)(int)value + 0x28)
                       = (char)value_15;
                  value = value + 1;
                }
              }
              else {
                *(undefined1 *)(frame_header_local->buffer_removal_time + 2) = 0;
                *(undefined1 *)((long)frame_header_local->buffer_removal_time + 0x1d) = 0;
              }
              value_1 = mpp_av1_read_unsigned
                                  ((BitReadCtx_t *)current_local,2,"grain_scaling_minus_8",&value_16
                                   ,0,3);
              ctx_local._4_4_ = value_1;
              if (-1 < (int)value_1) {
                *(undefined1 *)((long)frame_header_local->buffer_removal_time + 0x32) =
                     (undefined1)value_16;
                value_1 = mpp_av1_read_unsigned
                                    ((BitReadCtx_t *)current_local,2,"ar_coeff_lag",&value_17,0,3);
                ctx_local._4_4_ = value_1;
                if (-1 < (int)value_1) {
                  *(undefined1 *)((long)frame_header_local->buffer_removal_time + 0x33) =
                       (undefined1)value_17;
                  i = (uint)*(byte *)((long)frame_header_local->buffer_removal_time + 0x33) * 2 *
                      (*(byte *)((long)frame_header_local->buffer_removal_time + 0x33) + 1);
                  err = i;
                  if (*(char *)((long)&frame_header_local->frame_presentation_time + 2) != '\0') {
                    err = i + 1;
                    for (value = 0; (int)value < i; value = value + 1) {
                      value_1 = mpp_av1_read_unsigned
                                          ((BitReadCtx_t *)current_local,8,"ar_coeffs_y_plus_128[i]"
                                           ,&value_18,0,0xff);
                      if ((int)value_1 < 0) {
                        return value_1;
                      }
                      *(char *)((long)frame_header_local->buffer_removal_time +
                               (long)(int)value + 0x34) = (char)value_18;
                    }
                  }
                  if ((*(char *)((long)frame_header_local->buffer_removal_time + 7) != '\0') ||
                     ((char)frame_header_local->buffer_removal_time[2] != '\0')) {
                    for (value = 0; (int)value < err; value = value + 1) {
                      value_1 = mpp_av1_read_unsigned
                                          ((BitReadCtx_t *)current_local,8,
                                           "ar_coeffs_cb_plus_128[i]",&value_19,0,0xff);
                      if ((int)value_1 < 0) {
                        return value_1;
                      }
                      *(char *)((long)frame_header_local->buffer_removal_time +
                               (long)(int)value + 0x4c) = (char)value_19;
                    }
                  }
                  if ((*(char *)((long)frame_header_local->buffer_removal_time + 7) != '\0') ||
                     (*(char *)((long)frame_header_local->buffer_removal_time + 0x1d) != '\0')) {
                    value = 0;
                    while( true ) {
                      if (err <= (int)value) break;
                      value_1 = mpp_av1_read_unsigned
                                          ((BitReadCtx_t *)current_local,8,
                                           "ar_coeffs_cr_plus_128[i]",&value_20,0,0xff);
                      if ((int)value_1 < 0) {
                        return value_1;
                      }
                      *(char *)((long)frame_header_local->buffer_removal_time +
                               (long)(int)value + 0x65) = (char)value_20;
                      value = value + 1;
                    }
                  }
                  value_1 = mpp_av1_read_unsigned
                                      ((BitReadCtx_t *)current_local,2,"ar_coeff_shift_minus_6",
                                       &value_21,0,3);
                  ctx_local._4_4_ = value_1;
                  if (-1 < (int)value_1) {
                    *(undefined1 *)((long)frame_header_local->buffer_removal_time + 0x7e) =
                         (undefined1)value_21;
                    value_1 = mpp_av1_read_unsigned
                                        ((BitReadCtx_t *)current_local,2,"grain_scale_shift",
                                         &value_22,0,3);
                    ctx_local._4_4_ = value_1;
                    if (-1 < (int)value_1) {
                      *(undefined1 *)((long)frame_header_local->buffer_removal_time + 0x7f) =
                           (undefined1)value_22;
                      if ((char)frame_header_local->buffer_removal_time[2] != '\0') {
                        value_1 = mpp_av1_read_unsigned
                                            ((BitReadCtx_t *)current_local,8,"cb_mult",&value_23,0,
                                             0xff);
                        if ((int)value_1 < 0) {
                          return value_1;
                        }
                        frame_header_local->primary_ref_frame = (RK_U8)value_23;
                        value_1 = mpp_av1_read_unsigned
                                            ((BitReadCtx_t *)current_local,8,"cb_luma_mult",
                                             &value_24,0,0xff);
                        if ((int)value_1 < 0) {
                          return value_1;
                        }
                        frame_header_local->field_0x9d = (undefined1)value_24;
                        value_1 = mpp_av1_read_unsigned
                                            ((BitReadCtx_t *)current_local,9,"cb_offset",&value_25,0
                                             ,0x1ff);
                        if ((int)value_1 < 0) {
                          return value_1;
                        }
                        frame_header_local->frame_width_minus_1 = (RK_U16)value_25;
                      }
                      if (*(char *)((long)frame_header_local->buffer_removal_time + 0x1d) != '\0') {
                        value_1 = mpp_av1_read_unsigned
                                            ((BitReadCtx_t *)current_local,8,"cr_mult",&value_26,0,
                                             0xff);
                        if ((int)value_1 < 0) {
                          return value_1;
                        }
                        *(undefined1 *)&frame_header_local->frame_height_minus_1 =
                             (undefined1)value_26;
                        value_1 = mpp_av1_read_unsigned
                                            ((BitReadCtx_t *)current_local,8,"cr_luma_mult",
                                             &value_27,0,0xff);
                        if ((int)value_1 < 0) {
                          return value_1;
                        }
                        *(undefined1 *)((long)&frame_header_local->frame_height_minus_1 + 1) =
                             (undefined1)value_27;
                        value_1 = mpp_av1_read_unsigned
                                            ((BitReadCtx_t *)current_local,9,"cr_offset",&value_28,0
                                             ,0x1ff);
                        if ((int)value_1 < 0) {
                          return value_1;
                        }
                        frame_header_local->use_superres = (undefined1)value_28;
                        frame_header_local->coded_denom = value_28._1_1_;
                      }
                      value_1 = mpp_av1_read_unsigned
                                          ((BitReadCtx_t *)current_local,1,"overlap_flag",
                                           (RK_U32 *)local_b8,0,1);
                      ctx_local._4_4_ = value_1;
                      if (-1 < (int)value_1) {
                        frame_header_local->render_and_frame_size_different = local_b8[0];
                        ctx_local._4_4_ =
                             mpp_av1_read_unsigned
                                       ((BitReadCtx_t *)current_local,1,"clip_to_restricted_range",
                                        (RK_U32 *)local_bc,0,1);
                        if (-1 < (int)ctx_local._4_4_) {
                          frame_header_local->field_0xa5 = local_bc[0];
                          ctx_local._4_4_ = 0;
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return ctx_local._4_4_;
}

Assistant:

static RK_S32 mpp_av1_film_grain_params(AV1Context *ctx, BitReadCtx_t *gb,
                                        AV1RawFilmGrainParams *current,
                                        AV1RawFrameHeader *frame_header)
{
    const AV1RawSequenceHeader *seq = ctx->sequence_header;
    RK_S32 num_pos_luma, num_pos_chroma;
    RK_S32 i, err;

    if (!seq->film_grain_params_present ||
        (!frame_header->show_frame && !frame_header->showable_frame))
        return 0;

    flag(apply_grain);

    if (!current->apply_grain)
        return 0;

    fb(16, grain_seed);

    if (frame_header->frame_type == AV1_FRAME_INTER)
        flag(update_grain);
    else
        infer(update_grain, 1);

    if (!current->update_grain) {
        fb(3, film_grain_params_ref_idx);
        return 0;
    }

    fc(4, num_y_points, 0, 14);
    for (i = 0; i < current->num_y_points; i++) {
        fcs(8, point_y_value[i],
            i ? current->point_y_value[i - 1] + 1 : 0,
            MAX_UINT_BITS(8) - (current->num_y_points - i - 1),
            1, i);
        fbs(8, point_y_scaling[i], 1, i);
    }

    if (seq->color_config.mono_chrome)
        infer(chroma_scaling_from_luma, 0);
    else
        flag(chroma_scaling_from_luma);

    if (seq->color_config.mono_chrome ||
        current->chroma_scaling_from_luma ||
        (seq->color_config.subsampling_x == 1 &&
         seq->color_config.subsampling_y == 1 &&
         current->num_y_points == 0)) {
        infer(num_cb_points, 0);
        infer(num_cr_points, 0);
    } else {
        fc(4, num_cb_points, 0, 10);
        for (i = 0; i < current->num_cb_points; i++) {
            fcs(8, point_cb_value[i],
                i ? current->point_cb_value[i - 1] + 1 : 0,
                MAX_UINT_BITS(8) - (current->num_cb_points - i - 1),
                1, i);
            fbs(8, point_cb_scaling[i], 1, i);
        }
        fc(4, num_cr_points, 0, 10);
        for (i = 0; i < current->num_cr_points; i++) {
            fcs(8, point_cr_value[i],
                i ? current->point_cr_value[i - 1] + 1 : 0,
                MAX_UINT_BITS(8) - (current->num_cr_points - i - 1),
                1, i);
            fbs(8, point_cr_scaling[i], 1, i);
        }
    }

    fb(2, grain_scaling_minus_8);
    fb(2, ar_coeff_lag);
    num_pos_luma = 2 * current->ar_coeff_lag * (current->ar_coeff_lag + 1);
    if (current->num_y_points) {
        num_pos_chroma = num_pos_luma + 1;
        for (i = 0; i < num_pos_luma; i++)
            fbs(8, ar_coeffs_y_plus_128[i], 1, i);
    } else {
        num_pos_chroma = num_pos_luma;
    }
    if (current->chroma_scaling_from_luma || current->num_cb_points) {
        for (i = 0; i < num_pos_chroma; i++)
            fbs(8, ar_coeffs_cb_plus_128[i], 1, i);
    }
    if (current->chroma_scaling_from_luma || current->num_cr_points) {
        for (i = 0; i < num_pos_chroma; i++)
            fbs(8, ar_coeffs_cr_plus_128[i], 1, i);
    }
    fb(2, ar_coeff_shift_minus_6);
    fb(2, grain_scale_shift);
    if (current->num_cb_points) {
        fb(8, cb_mult);
        fb(8, cb_luma_mult);
        fb(9, cb_offset);
    }
    if (current->num_cr_points) {
        fb(8, cr_mult);
        fb(8, cr_luma_mult);
        fb(9, cr_offset);
    }

    flag(overlap_flag);
    flag(clip_to_restricted_range);

    return 0;
}